

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::EntryConcat(RecyclableObject *function,CallInfo callInfo,...)

{
  Type *pTVar1;
  ScriptContext *pSVar2;
  ScriptContext *scriptContext;
  JavascriptLibrary *pJVar3;
  _func_int *p_Var4;
  code *pcVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  BOOL BVar11;
  uint32 uVar12;
  int iVar13;
  undefined4 *puVar14;
  Var pvVar15;
  JavascriptCopyOnAccessNativeIntArray *pJVar16;
  JavascriptArray *pJVar17;
  int64 iVar18;
  JavascriptNativeIntArray *pJVar19;
  JavascriptNativeFloatArray *fArray;
  TypeId *remoteTypeIds;
  ulong uVar20;
  byte bVar21;
  double value;
  int in_stack_00000010;
  undefined1 *puStack_b0;
  double local_a8 [2];
  CallInfo local_98;
  CallInfo callInfo_local;
  ArgumentReader args;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  RecordOverflowPolicy local_35;
  uint local_34;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  puStack_b0 = (undefined1 *)0xb7319c;
  local_98 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    puStack_b0 = (undefined1 *)0xb731b2;
    Throw::LogAssert();
    puStack_b0 = (undefined1 *)0xb731c2;
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    puStack_b0 = (undefined1 *)0xb731ea;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xe0b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) goto LAB_00b73b48;
    *puVar14 = 0;
  }
  puStack_b0 = (undefined1 *)0xb7321a;
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_98);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_70 = (undefined1  [8])pSVar2->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_70)->noJsReentrancy;
  ((ThreadContext *)local_70)->noJsReentrancy = true;
  if (((ulong)local_98 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    puStack_b0 = (undefined1 *)0xb73262;
    Throw::LogAssert();
    puStack_b0 = (undefined1 *)0xb73272;
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    puStack_b0 = (undefined1 *)0xb7329a;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xe0f,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar7) {
LAB_00b73b48:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar14 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    puStack_b0 = &LAB_00b73b5e;
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec42,L"Array.prototype.concat");
  }
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  puStack_b0 = (undefined1 *)0xb732e5;
  ThreadContext::ProbeStackNoDispose
            (scriptContext->threadContext,(ulong)(callInfo_local._0_4_ & 0xffffff) * 8 + 0xc00,
             scriptContext,(PVOID)0x0);
  lVar6 = -(ulong)((callInfo_local._0_4_ & 0xffffff) * 8 + 0xf & 0xfffffff0);
  remoteTypeIds = (TypeId *)((long)local_a8 + lVar6);
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    uVar10 = 0;
    bVar7 = true;
    local_35.fOverflow = false;
    local_34 = (uint)CONCAT71(callInfo_local._1_7_,1);
  }
  else {
    local_34 = (uint)CONCAT71(callInfo_local._1_7_,1);
    *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb7332f;
    jsReentLock._24_8_ = __tls_get_addr(&PTR_01548f08);
    uVar20 = 0;
    uVar10 = 0;
    bVar7 = true;
    bVar9 = false;
    do {
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73354;
      pvVar15 = Arguments::operator[]((Arguments *)&callInfo_local,(int)uVar20);
      if (pvVar15 != (Var)0x0) {
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73364;
        bVar8 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar15);
        if (bVar8) {
          *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73370;
          pJVar16 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar15);
          if (pJVar16 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
            *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb7337d;
            JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar16);
          }
        }
      }
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73385;
      bVar8 = DynamicObject::IsAnyArray(pvVar15);
      local_35.fOverflow = bVar9;
      if (bVar8) {
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73391;
        pJVar17 = FromAnyArray(pvVar15);
        if (bVar7 != false) {
          *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb733a2;
          bVar9 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pJVar17);
          if (!bVar9) {
            *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb733ae;
            bVar9 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pJVar17);
            local_34 = 0;
            if (!bVar9) {
              bVar7 = false;
            }
          }
        }
        pTVar1 = &(pJVar17->super_ArrayObject).length;
        bVar9 = CARRY4(uVar10,*pTVar1);
        uVar10 = uVar10 + *pTVar1;
        if (bVar9) {
          local_35.fOverflow = true;
        }
      }
      else {
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb733fb;
        bVar8 = JavascriptOperators::IsArray(pvVar15);
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73407;
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        *(bool *)((long)local_70 + 0x108) = true;
        if (bVar8) {
          *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb7341f;
          bVar7 = VarIs<Js::JavascriptProxy>(pvVar15);
          if (!bVar7) {
            bVar7 = ((pSVar2->config).threadConfig)->m_ES6ToLength;
            *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            if (bVar7 == true) {
              *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73508;
              pvVar15 = JavascriptOperators::OP_GetLength(pvVar15,pSVar2);
              *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73518;
              iVar18 = JavascriptConversion::ToLength(pvVar15,pSVar2);
              *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73524;
              JsReentLock::MutateArrayObject((JsReentLock *)local_70);
              *(bool *)((long)local_70 + 0x108) = true;
              if (0xfffffffe < iVar18) {
                iVar18 = 0xffffffff;
              }
              bVar7 = CARRY4(uVar10,(uint)iVar18);
              uVar10 = uVar10 + (uint)iVar18;
              if (bVar7) {
                bVar9 = true;
              }
            }
            else {
              *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73560;
              pvVar15 = JavascriptOperators::OP_GetLength(pvVar15,pSVar2);
              if (((ulong)pvVar15 & 0x1ffff00000000) == 0x1000000000000 ||
                  ((ulong)pvVar15 & 0xffff000000000000) != 0x1000000000000) {
                if (((ulong)pvVar15 & 0xffff000000000000) == 0x1000000000000) goto LAB_00b736af;
                *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73794;
                uVar12 = JavascriptConversion::ToUInt32_Full(pvVar15,pSVar2);
                pvVar15 = (Var)(ulong)uVar12;
              }
              else {
                AssertCount = AssertCount + 1;
                *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb735b0;
                Throw::LogAssert();
                *(undefined4 *)jsReentLock._24_8_ = 1;
                *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb735d9;
                bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar7) goto LAB_00b73b48;
                *(undefined4 *)jsReentLock._24_8_ = 0;
LAB_00b736af:
                if (((ulong)pvVar15 & 0x1ffff00000000) != 0x1000000000000) {
                  AssertCount = AssertCount + 1;
                  *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb736d0;
                  Throw::LogAssert();
                  *(undefined4 *)jsReentLock._24_8_ = 1;
                  *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb736f9;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                              ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                              "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                  if (!bVar7) goto LAB_00b73b48;
                  *(undefined4 *)jsReentLock._24_8_ = 0;
                }
              }
              *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb737a0;
              JsReentLock::MutateArrayObject((JsReentLock *)local_70);
              *(bool *)((long)local_70 + 0x108) = true;
              bVar7 = CARRY4((uint)pvVar15,uVar10);
              uVar10 = (uint)pvVar15 + uVar10;
              if (bVar7) {
                bVar9 = true;
              }
            }
          }
          remoteTypeIds[uVar20] = TypeIds_Array;
          bVar7 = false;
          local_34 = 0;
          local_35.fOverflow = bVar9;
        }
        else {
          if (bVar7 != false) {
            if (uVar20 == 0) {
              *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb7344a;
              BVar11 = JavascriptOperators::IsObject(pvVar15);
              if (BVar11 != 0) goto LAB_00b73452;
LAB_00b73776:
              local_34 = 0;
              bVar7 = false;
            }
            else {
LAB_00b73452:
              if (((ulong)pvVar15 & 0x1ffff00000000) == 0x1000000000000 ||
                  ((ulong)pvVar15 & 0xffff000000000000) != 0x1000000000000) {
                if (((ulong)pvVar15 & 0xffff000000000000) == 0x1000000000000) goto LAB_00b735f9;
                if ((ulong)pvVar15 >> 0x32 == 0) goto LAB_00b73776;
                if ((local_34 & 1) == 0) goto LAB_00b7367f;
                value = (double)((ulong)pvVar15 ^ 0xfffc000000000000);
                if (((double)(int)value != value) || (NAN((double)(int)value) || NAN(value))) {
LAB_00b7376a:
                  local_34 = 0;
                  goto LAB_00b7367f;
                }
                local_a8[1] = 0.0;
                local_a8[0] = value;
                *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73762;
                bVar9 = NumberUtilities::IsSpecial(value,0x8000000000000000);
                if (bVar9) goto LAB_00b7376a;
                iVar13 = (int)local_a8[0];
              }
              else {
                AssertCount = AssertCount + 1;
                *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb7349e;
                Throw::LogAssert();
                *(undefined4 *)jsReentLock._24_8_ = 1;
                *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb734c7;
                bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar9) goto LAB_00b73b48;
                *(undefined4 *)jsReentLock._24_8_ = 0;
LAB_00b735f9:
                if ((local_34 & 1) == 0) goto LAB_00b7367f;
                if (((ulong)pvVar15 & 0x1ffff00000000) != 0x1000000000000) {
                  AssertCount = AssertCount + 1;
                  *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73623;
                  Throw::LogAssert();
                  *(undefined4 *)jsReentLock._24_8_ = 1;
                  *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb7364c;
                  bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                              ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                              "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                  if (!bVar9) goto LAB_00b73b48;
                  *(undefined4 *)jsReentLock._24_8_ = 0;
                }
                iVar13 = (int)pvVar15;
              }
              local_34 = local_34 & 0xff;
              if (iVar13 == -0x7fffe) {
                local_34 = 0;
              }
            }
          }
LAB_00b7367f:
          remoteTypeIds[uVar20] = TypeIds_Limit;
          uVar10 = uVar10 + 1;
          if (uVar10 == 0) {
            local_35.fOverflow = true;
          }
        }
      }
      uVar20 = uVar20 + 1;
      bVar9 = local_35.fOverflow;
    } while (uVar20 < (callInfo_local._0_4_ & 0xffffff));
  }
  if (local_35.fOverflow) {
    bVar7 = false;
  }
  bVar21 = (byte)local_34;
  if (local_35.fOverflow) {
    bVar21 = 0;
  }
  uVar12 = 0xffffffff;
  if (!local_35.fOverflow) {
    uVar12 = uVar10;
  }
  *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73855;
  pvVar15 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb7386e;
  pJVar17 = (JavascriptArray *)
            ArraySpeciesCreate<int>(pvVar15,0,pSVar2,(bool *)0x0,(bool *)0x0,(bool *)0x0);
  *(bool *)((long)local_70 + 0x108) = true;
  if (pJVar17 == (JavascriptArray *)0x0) {
    if ((bVar21 & 1) == 0) {
      if (bVar7 == false) {
LAB_00b73aba:
        pJVar3 = (pSVar2->super_ScriptContextBase).javascriptLibrary;
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73ac7;
        pJVar17 = JavascriptLibrary::CreateArray(pJVar3,uVar12);
        goto LAB_00b73ac7;
      }
LAB_00b73a55:
      pJVar3 = (pSVar2->super_ScriptContextBase).javascriptLibrary;
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73a62;
      pJVar17 = (JavascriptArray *)JavascriptLibrary::CreateNativeFloatArray(pJVar3,uVar12);
LAB_00b73a62:
      if ((pJVar17->head).ptr == EmptySegment) {
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73a7d;
        AllocateHead<double>(pJVar17);
      }
      *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73aa0;
      ConcatFloatArgs((JavascriptNativeFloatArray *)pJVar17,remoteTypeIds,
                      (Arguments *)&callInfo_local,pSVar2);
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73aa9;
      JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    }
    else {
LAB_00b739a3:
      pJVar3 = (pSVar2->super_ScriptContextBase).javascriptLibrary;
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb739b0;
      pJVar17 = (JavascriptArray *)JavascriptLibrary::CreateNativeIntArray(pJVar3,uVar12);
LAB_00b739b0:
      if ((pJVar17->head).ptr == EmptySegment) {
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb739cb;
        AllocateHead<int>(pJVar17);
      }
      *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb739ee;
      ConcatIntArgs((JavascriptNativeIntArray *)pJVar17,remoteTypeIds,(Arguments *)&callInfo_local,
                    pSVar2);
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb739f7;
      JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    }
  }
  else {
    *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73889;
    bVar9 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar17);
    if (bVar9) {
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73895;
      pJVar16 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar17);
      if (pJVar16 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb738a2;
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar16);
      }
    }
    if ((bVar21 & 1) == 0) {
      if (bVar7 == false) {
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb7392b;
        bVar9 = VarIs<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                          ((RecyclableObject *)pJVar17);
        if (bVar9) {
          *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73937;
          pJVar19 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                              ((RecyclableObject *)pJVar17);
          if (pJVar19 != (JavascriptNativeIntArray *)0x0) {
            *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73944;
            JavascriptNativeIntArray::ToVarArray(pJVar19);
            goto LAB_00b7398e;
          }
        }
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73963;
        bVar9 = VarIs<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                          ((RecyclableObject *)pJVar17);
        if (bVar9) {
          *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb7396f;
          fArray = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                             ((RecyclableObject *)pJVar17);
          if (fArray != (JavascriptNativeFloatArray *)0x0) {
            *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb7397c;
            JavascriptNativeFloatArray::ToVarArray(fArray);
            goto LAB_00b7398e;
          }
        }
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73986;
        bVar9 = IsNonES5Array(pJVar17);
      }
      else {
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73908;
        bVar9 = VarIs<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                          ((RecyclableObject *)pJVar17);
        if (bVar9) {
          *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73914;
          pJVar19 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                              ((RecyclableObject *)pJVar17);
          if (pJVar19 != (JavascriptNativeIntArray *)0x0) {
            *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73921;
            JavascriptNativeIntArray::ToNativeFloatArray(pJVar19);
            goto LAB_00b7398e;
          }
        }
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb7394e;
        bVar7 = VarIs<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                          ((RecyclableObject *)pJVar17);
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73959;
        bVar9 = IsNonES5Array(pJVar17);
      }
      if (bVar9 == false) {
LAB_00b73a15:
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73a3c;
        ConcatArgsCallingHelper
                  ((RecyclableObject *)pJVar17,remoteTypeIds,(Arguments *)&callInfo_local,pSVar2,
                   &local_35);
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73a45;
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        *(bool *)((long)local_70 + 0x108) = true;
        goto LAB_00b73b2d;
      }
LAB_00b7398e:
      if ((bVar21 & 1) != 0) {
        if (pJVar17 == (JavascriptArray *)0x0) goto LAB_00b739a3;
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb739a1;
        pJVar17 = (JavascriptArray *)
                  VarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                            ((RecyclableObject *)pJVar17);
        goto LAB_00b739b0;
      }
      if (bVar7 != false) {
        if (pJVar17 == (JavascriptArray *)0x0) goto LAB_00b73a55;
LAB_00b73a0b:
        *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73a13;
        pJVar17 = (JavascriptArray *)
                  VarTo<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                            ((RecyclableObject *)pJVar17);
        goto LAB_00b73a62;
      }
      if (pJVar17 == (JavascriptArray *)0x0) goto LAB_00b73aba;
    }
    else {
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb738b0;
      bVar9 = VarIs<Js::JavascriptNativeIntArray,Js::RecyclableObject>((RecyclableObject *)pJVar17);
      if (bVar9) goto LAB_00b7398e;
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb738c0;
      bVar7 = VarIs<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                        ((RecyclableObject *)pJVar17);
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb738cb;
      bVar9 = IsNonES5Array(pJVar17);
      if (!bVar9) goto LAB_00b73a15;
      if (bVar7) goto LAB_00b73a0b;
    }
    *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73ab8;
    pJVar17 = VarTo<Js::JavascriptArray,Js::RecyclableObject>((RecyclableObject *)pJVar17);
LAB_00b73ac7:
    if ((pJVar17->head).ptr == EmptySegment) {
      *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73ae2;
      AllocateHead<void*>(pJVar17);
    }
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73b09;
    ConcatArgsCallingHelper
              ((RecyclableObject *)pJVar17,remoteTypeIds,(Arguments *)&callInfo_local,pSVar2,
               &local_35);
    *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73b12;
    JsReentLock::MutateArrayObject((JsReentLock *)local_70);
  }
  *(bool *)((long)local_70 + 0x108) = true;
  p_Var4 = (pJVar17->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
           super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74];
  *(undefined8 *)((long)&puStack_b0 + lVar6) = 0xb73b29;
  (*p_Var4)(pJVar17);
LAB_00b73b2d:
  ((ThreadContext *)local_70)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
  return pJVar17;
}

Assistant:

Var JavascriptArray::EntryConcat(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Concat);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.concat"));
        }

        //
        // Compute the destination ScriptArray size:
        // - Each item, flattening only one level if a ScriptArray.
        //

        uint32 cDestLength = 0;
        JavascriptArray * pDestArray = NULL;

        PROBE_STACK_NO_DISPOSE(function->GetScriptContext(), Js::Constants::MinStackDefault + (args.Info.Count * sizeof(TypeId*)));
        TypeId* remoteTypeIds = (TypeId*)_alloca(args.Info.Count * sizeof(TypeId*));

        bool isInt = true;
        bool isFloat = true;
        ::Math::RecordOverflowPolicy destLengthOverflow;
        for (uint idxArg = 0; idxArg < args.Info.Count; idxArg++)
        {
            Var aItem = args[idxArg];
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(aItem);
#endif
            if (DynamicObject::IsAnyArray(aItem)) // Get JavascriptArray or ES5Array length
            {
                JavascriptArray * pItemArray = JavascriptArray::FromAnyArray(aItem);
                if (isFloat)
                {
                    if (!VarIs<JavascriptNativeIntArray>(pItemArray))
                    {
                        isInt = false;
                        if (!VarIs<JavascriptNativeFloatArray>(pItemArray))
                        {
                            isFloat = false;
                        }
                    }
                }
                cDestLength = UInt32Math::Add(cDestLength, pItemArray->GetLength(), destLengthOverflow);
            }
            else // Get remote array or object length
            {
                // We already checked for types derived from JavascriptArray. These are types that should behave like array
                // i.e. proxy to array and remote array.
                JS_REENTRANT(jsReentLock, BOOL isArray = JavascriptOperators::IsArray(aItem));
                if (isArray)
                {
                    // Don't try to preserve nativeness of remote arrays. The extra complexity is probably not
                    // worth it.
                    isInt = false;
                    isFloat = false;
                    if (!VarIs<JavascriptProxy>(aItem))
                    {
                        if (scriptContext->GetConfig()->IsES6ToLengthEnabled())
                        {
                            JS_REENTRANT(jsReentLock,
                                int64 len = JavascriptConversion::ToLength(JavascriptOperators::OP_GetLength(aItem, scriptContext), scriptContext));
                            // clipping to MaxArrayLength will overflow when added to cDestLength which we catch below
                            cDestLength = UInt32Math::Add(cDestLength, len < MaxArrayLength ? (uint32)len : MaxArrayLength, destLengthOverflow);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock,
                                uint len = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetLength(aItem, scriptContext), scriptContext));
                            cDestLength = UInt32Math::Add(cDestLength, len, destLengthOverflow);
                        }
                    }
                    remoteTypeIds[idxArg] = TypeIds_Array; // Mark remote array, no matter remote JavascriptArray or ES5Array.
                }
                else
                {
                    if (isFloat)
                    {
                        if (BoxConcatItem(aItem, idxArg, scriptContext))
                        {
                            // A primitive will be boxed, so we have to create a var array for the result.
                            isInt = false;
                            isFloat = false;
                        }
                        else if (!TaggedInt::Is(aItem))
                        {
                            if (!JavascriptNumber::Is(aItem))
                            {
                                isInt = false;
                                isFloat = false;
                            }
                            else if (isInt)
                            {
                                int32 int32Value;
                                if(!JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(aItem), &int32Value) ||
                                    SparseArraySegment<int32>::IsMissingItem(&int32Value))
                                {
                                    isInt = false;
                                }
                            }
                        }
                        else if(isInt)
                        {
                            int32 int32Value = TaggedInt::ToInt32(aItem);
                            if(SparseArraySegment<int32>::IsMissingItem(&int32Value))
                            {
                                isInt = false;
                            }
                        }
                    }

                    remoteTypeIds[idxArg] = TypeIds_Limit;
                    cDestLength = UInt32Math::Add(cDestLength, 1, destLengthOverflow);
                }
            }
        }
        if (destLengthOverflow.HasOverflowed())
        {
            cDestLength = MaxArrayLength;
            isInt = false;
            isFloat = false;
        }

        //
        // Create the destination array
        //
        RecyclableObject* pDestObj = nullptr;
        bool isArray = false;

        JS_REENTRANT_NO_MUTATE(jsReentLock, pDestObj = ArraySpeciesCreate(args[0], 0, scriptContext));

        if (pDestObj)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pDestObj);
#endif
            // Check the thing that species create made. If it's a native array that can't handle the source
            // data, convert it. If it's a more conservative kind of array than the source data, indicate that
            // so that the data will be converted on copy.
            if (isInt)
            {
                if (VarIs<JavascriptNativeIntArray>(pDestObj))
                {
                    isArray = true;
                }
                else
                {
                    isInt = false;
                    isFloat = VarIs<JavascriptNativeFloatArray>(pDestObj);
                    isArray = JavascriptArray::IsNonES5Array(pDestObj);
                }
            }
            else if (isFloat)
            {
                JavascriptNativeIntArray *nativeIntArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(pDestObj);
                if (nativeIntArray)
                {
                    JavascriptNativeIntArray::ToNativeFloatArray(nativeIntArray);
                    isArray = true;
                }
                else
                {
                    isFloat = VarIs<JavascriptNativeFloatArray>(pDestObj);
                    isArray = JavascriptArray::IsNonES5Array(pDestObj);
                }
            }
            else
            {
                JavascriptNativeIntArray *nativeIntArray = JavascriptOperators::TryFromVar<Js::JavascriptNativeIntArray>(pDestObj);
                if (nativeIntArray)
                {
                    JavascriptNativeIntArray::ToVarArray(nativeIntArray);
                    isArray = true;
                }
                else
                {
                    JavascriptNativeFloatArray *nativeFloatArray = JavascriptOperators::TryFromVar<Js::JavascriptNativeFloatArray>(pDestObj);
                    if (nativeFloatArray)
                    {
                        JavascriptNativeFloatArray::ToVarArray(nativeFloatArray);
                        isArray = true;
                    }
                    else
                    {
                        isArray = JavascriptArray::IsNonES5Array(pDestObj);
                    }
                }
            }
        }

        if (pDestObj == nullptr || isArray)
        {
            if (isInt)
            {
                JavascriptNativeIntArray *pIntArray = isArray ? VarTo<JavascriptNativeIntArray>(pDestObj) : scriptContext->GetLibrary()->CreateNativeIntArray(cDestLength);
                pIntArray->EnsureHead<int32>();

                JS_REENTRANT(jsReentLock, pDestArray = ConcatIntArgs(pIntArray, remoteTypeIds, args, scriptContext));
            }
            else if (isFloat)
            {
                JavascriptNativeFloatArray *pFArray = isArray ? VarTo<JavascriptNativeFloatArray>(pDestObj) : scriptContext->GetLibrary()->CreateNativeFloatArray(cDestLength);
                pFArray->EnsureHead<double>();

                JS_REENTRANT(jsReentLock, pDestArray = ConcatFloatArgs(pFArray, remoteTypeIds, args, scriptContext));
            }
            else
            {

                pDestArray = isArray ?  VarTo<JavascriptArray>(pDestObj) : scriptContext->GetLibrary()->CreateArray(cDestLength);
                // if the constructor has changed then we no longer specialize for ints and floats
                pDestArray->EnsureHead<Var>();

                JS_REENTRANT(jsReentLock, ConcatArgsCallingHelper(pDestArray, remoteTypeIds, args, scriptContext, destLengthOverflow));
            }

            //
            // Return the new array instance.
            //

#ifdef VALIDATE_ARRAY
            pDestArray->ValidateArray();
#endif

            return pDestArray;
        }

        Assert(pDestObj);
        JS_REENTRANT(jsReentLock, ConcatArgsCallingHelper(pDestObj, remoteTypeIds, args, scriptContext, destLengthOverflow));

        return pDestObj;
        JIT_HELPER_END(Array_Concat);
    }